

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * ghc::filesystem::relative(path *__return_storage_ptr__,path *p,error_code *ec)

{
  path local_40;
  
  current_path(&local_40,ec);
  relative(__return_storage_ptr__,p,&local_40,ec);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path relative(const path& p, std::error_code& ec)
{
    return relative(p, current_path(ec), ec);
}